

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoimax.c
# Opt level: O3

intmax_t strtoimax(char *__nptr,char **__endptr,int __base)

{
  unsigned_long uVar1;
  uintmax_t error;
  unsigned_long uVar2;
  char sign;
  char *p;
  char local_29;
  char *local_28;
  uint local_1c;
  
  local_29 = '+';
  local_1c = __base;
  local_28 = _PDCLIB_strtox_prelim(__nptr,&local_29,(int *)&local_1c);
  if (local_1c - 0x25 < 0xffffffdd) {
    uVar2 = 0;
  }
  else {
    error = 0x8000000000000000;
    if (local_29 == '+') {
      error = 0x7fffffffffffffff;
    }
    uVar1 = _PDCLIB_strtox_main(&local_28,local_1c,error,error / local_1c,
                                (int)(error % (ulong)local_1c),&local_29);
    if (__endptr != (char **)0x0) {
      if (local_28 != (char *)0x0) {
        __nptr = local_28;
      }
      *__endptr = __nptr;
    }
    uVar2 = -uVar1;
    if (local_29 == '+') {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

intmax_t strtoimax( const char * _PDCLIB_restrict nptr, char ** _PDCLIB_restrict endptr, int base )
{
    intmax_t rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( nptr, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    if ( sign == '+' )
    {
        rc = ( intmax_t )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )INTMAX_MAX, ( uintmax_t )( INTMAX_MAX / base ), ( int )( INTMAX_MAX % base ), &sign );
    }
    else
    {
        rc = ( intmax_t )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )INTMAX_MIN, ( uintmax_t )( INTMAX_MIN / -base ), ( int )( -( INTMAX_MIN % base ) ), &sign );
    }

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) nptr;
    }

    return ( sign == '+' ) ? rc : -rc;
}